

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PPlot.cpp
# Opt level: O2

bool __thiscall
SVGChart::PlotDataContainer::CalculateXRange(PlotDataContainer *this,float *outXMin,float *outXMax)

{
  PlotDataBase *this_00;
  byte bVar1;
  int iVar2;
  undefined8 in_RAX;
  long lVar3;
  pointer ppPVar4;
  bool bVar5;
  float theXMax;
  float theXMin;
  undefined8 local_38;
  
  *outXMin = 0.0;
  *outXMax = 0.0;
  ppPVar4 = (this->mXDataList).
            super__Vector_base<SVGChart::PlotDataBase_*,_std::allocator<SVGChart::PlotDataBase_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  bVar5 = true;
  local_38 = in_RAX;
  do {
    if (ppPVar4 ==
        (this->mXDataList).
        super__Vector_base<SVGChart::PlotDataBase_*,_std::allocator<SVGChart::PlotDataBase_*>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      bVar1 = -(*outXMin != 0.0 || *outXMax != 0.0);
LAB_00104444:
      return (bool)(bVar1 & 1);
    }
    this_00 = *ppPVar4;
    if (this_00 == (PlotDataBase *)0x0) goto LAB_00104425;
    lVar3 = PlotDataBase::GetSize(this_00);
    if (lVar3 != 0) {
      iVar2 = (*this_00->_vptr_PlotDataBase[4])(this_00,(long)&local_38 + 4,&local_38);
      if ((char)iVar2 != '\0') {
        if (local_38._4_4_ <= (float)local_38) {
          if (bVar5) {
            *outXMin = local_38._4_4_;
LAB_0010440a:
            *outXMax = (float)local_38;
          }
          else if (*outXMax <= (float)local_38 && (float)local_38 != *outXMax) goto LAB_0010440a;
          if (local_38._4_4_ < *outXMin) {
            *outXMin = local_38._4_4_;
          }
          bVar5 = false;
          goto LAB_0010441f;
        }
      }
LAB_00104425:
      bVar1 = 0;
      goto LAB_00104444;
    }
LAB_0010441f:
    ppPVar4 = ppPVar4 + 1;
  } while( true );
}

Assistant:

bool PlotDataContainer::CalculateXRange (float &outXMin, float &outXMax) const {
      bool theFirst = true;
      outXMin = 0;
      outXMax = 0;
      for (PlotDataList::const_iterator theI=mXDataList.begin();theI!=mXDataList.end ();theI++) {
        PlotDataBase *theXDataBase = *theI;
        if (!theXDataBase) {
          return false;
        }
        if (theXDataBase->GetSize () == 0) {
            continue;
        }
        float theXMin;
        float theXMax;
        if (!theXDataBase->CalculateRange (theXMin, theXMax)) {
          return false;
        }
        if (theXMax < theXMin) {
            return false;
        }
        if (theFirst) {
          outXMin = theXMin;
          outXMax = theXMax;
          theFirst = false;
        }
        if (theXMax>outXMax) {
          outXMax = theXMax;
        }
        if (theXMin<outXMin) {
          outXMin = theXMin;
        }
      }
      if (outXMin == 0 && outXMax == 0) {
          return false;
      }
      return true;
    }